

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.cpp
# Opt level: O0

void testOpenScans(string *tempdir)

{
  int iVar1;
  undefined8 uVar2;
  ostream *poVar3;
  char *pcVar4;
  ostream *this;
  exr_result_t _test_rv_2;
  exr_result_t _test_rv_1;
  exr_result_t _test_rv;
  exr_context_initializer_t cinit;
  string fn;
  exr_context_t f;
  char *in_stack_fffffffffffffe98;
  undefined8 in_stack_fffffffffffffea0;
  uint line;
  char *in_stack_fffffffffffffea8;
  char *in_stack_fffffffffffffeb0;
  allocator<char> *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  undefined8 local_b8;
  code *pcStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  allocator<char> local_31;
  string local_30 [32];
  undefined1 local_10 [16];
  
  line = (uint)((ulong)in_stack_fffffffffffffea0 >> 0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  std::allocator<char>::~allocator(&local_31);
  std::__cxx11::string::operator+=(local_30,"v1.7.test.1.exr");
  local_68 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_58 = 0;
  local_b8 = 0x68;
  uStack_60 = 0xbf800000fffffffe;
  pcStack_b0 = err_cb;
  uVar2 = std::__cxx11::string::c_str();
  iVar1 = exr_start_read(local_10,uVar2,&local_b8);
  if (iVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,line,
                   in_stack_fffffffffffffe98);
  }
  exr_finish(local_10);
  std::__cxx11::string::operator=
            (local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRCoreTest/../OpenEXRTest/"
            );
  std::__cxx11::string::operator+=(local_30,"v1.7.test.planar.exr");
  uVar2 = std::__cxx11::string::c_str();
  iVar1 = exr_start_read(local_10,uVar2,&local_b8);
  if (iVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,line,
                   in_stack_fffffffffffffe98);
  }
  exr_finish(local_10);
  std::__cxx11::string::operator=
            (local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRCoreTest/../OpenEXRTest/"
            );
  std::__cxx11::string::operator+=(local_30,"v1.7.test.interleaved.exr");
  uVar2 = std::__cxx11::string::c_str();
  iVar1 = exr_start_read(local_10,uVar2,&local_b8);
  if (iVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    this = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)poVar3,pcVar4,(uint)((ulong)this >> 0x20),in_stack_fffffffffffffe98);
  }
  exr_finish(local_10);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void
testOpenScans (const std::string& tempdir)
{
    exr_context_t f;
    std::string   fn = ILM_IMF_TEST_IMAGEDIR;
    fn += "v1.7.test.1.exr";

    exr_context_initializer_t cinit = EXR_DEFAULT_CONTEXT_INITIALIZER;
    cinit.error_handler_fn          = &err_cb;

    EXRCORE_TEST_RVAL (exr_start_read (&f, fn.c_str (), &cinit));
    exr_finish (&f);

    fn = ILM_IMF_TEST_IMAGEDIR;
    fn += "v1.7.test.planar.exr";
    EXRCORE_TEST_RVAL (exr_start_read (&f, fn.c_str (), &cinit));
    exr_finish (&f);

    fn = ILM_IMF_TEST_IMAGEDIR;
    fn += "v1.7.test.interleaved.exr";
    EXRCORE_TEST_RVAL (exr_start_read (&f, fn.c_str (), &cinit));
    exr_finish (&f);
}